

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CoverCrossSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverCrossSyntax,slang::syntax::CoverCrossSyntax_const&>
          (BumpAllocator *this,CoverCrossSyntax *args)

{
  CoverCrossSyntax *this_00;
  
  this_00 = (CoverCrossSyntax *)allocate(this,0x110,8);
  slang::syntax::CoverCrossSyntax::CoverCrossSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }